

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

void scp::_scp::cooleyTukeyRadix2<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size)

{
  complex<double> *__y;
  double dVar1;
  double dVar2;
  long lVar3;
  ulong size_00;
  complex<double> *x0;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  double dVar5;
  
  if (size == 2) {
    dVar5 = *(double *)beg->_M_value;
    dVar2 = *(double *)(beg->_M_value + 8);
    std::operator*(base,beg + stride);
    dVar1 = *(double *)(beg->_M_value + 8);
    *(double *)beg->_M_value = extraout_XMM0_Qa + *(double *)beg->_M_value;
    *(double *)(beg->_M_value + 8) = in_XMM1_Qa + dVar1;
    std::operator*(base + baseStride,beg + stride);
    *(double *)beg[stride]._M_value = extraout_XMM0_Qa_00 + dVar5;
    *(double *)(beg[stride]._M_value + 8) = in_XMM1_Qa + dVar2;
  }
  else {
    size_00 = size >> 1;
    cooleyTukeyRadix2<std::complex<double>>(beg,stride,base,baseStride * 2,size_00);
    lVar3 = size_00 * stride;
    cooleyTukeyRadix2<std::complex<double>>(beg + lVar3,stride,base,baseStride * 2,size_00);
    for (lVar4 = 0; lVar3 * 0x10 != lVar4; lVar4 = lVar4 + stride * 0x10) {
      __y = beg + lVar3;
      std::operator*(base,__y);
      dVar1 = *(double *)(beg->_M_value + 8);
      *(double *)__y->_M_value = *(double *)beg->_M_value - extraout_XMM0_Qa_01;
      *(double *)(__y->_M_value + 8) = dVar1 - in_XMM1_Qa;
      dVar1 = *(double *)(beg->_M_value + 8);
      dVar5 = *(double *)beg->_M_value + extraout_XMM0_Qa_01;
      *(double *)beg->_M_value = dVar5;
      *(double *)(beg->_M_value + 8) = dVar1 + in_XMM1_Qa;
      beg = beg + stride;
      base = base + baseStride;
      in_XMM1_Qa = dVar5;
    }
  }
  return;
}

Assistant:

constexpr void cooleyTukeyRadix2(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size)
		{
			if (size == 2)
			{
				TValue& x0 = *beg;
				TValue& x1 = *(beg + stride);
				const TValue tmp = x0;
				x0 += *base * x1;
				x1 = tmp + *(base + baseStride) * x1;
			}
			else
			{
				size >>= 1;
				baseStride <<= 1;

				cooleyTukeyRadix2(beg, stride, base, baseStride, size);
				cooleyTukeyRadix2(beg + size * stride, stride, base, baseStride, size);

				baseStride >>= 1;

				TValue* it = beg;
				TValue* it2 = it + size * stride;
				const TValue* const itEnd = it2;
				for (; it != itEnd; it += stride, it2 += stride, base += baseStride)
				{
					TValue tmp = *base * *it2;
					*it2 = *it - tmp;
					*it += tmp;
				}
			}
		}